

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtest.cpp
# Opt level: O3

bool __thiscall hashtest::DoLruHashTest(hashtest *this,char **hash_input,size_t nb_input)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  hashTestKey *phVar6;
  size_t sVar7;
  LruHash<hashTestKey> *this_00;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  bool stored;
  LruHash<hashTestKey> hashTable;
  hashTestKey key;
  bool local_a9;
  size_t local_a8;
  char **local_a0;
  LruHash<hashTestKey> local_98;
  hashTestKey local_70;
  
  local_98.binHash.tableSize = 0;
  local_98.binHash.tableCount = 0;
  local_98.binHash.hashBin = (hashTestKey **)0x0;
  local_98.MostRecentlyUsed = (hashTestKey *)0x0;
  local_98.LeastRecentlyUsed = (hashTestKey *)0x0;
  local_98.targetSize = 0;
  local_a8 = nb_input;
  local_a0 = hash_input;
  if (nb_input == 0) {
LAB_0017d22e:
    bVar2 = LruCheck(this,&local_98);
  }
  else {
    uVar9 = 0;
    bVar2 = true;
    do {
      pcVar1 = local_a0[uVar9];
      sVar5 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      if (0xf < sVar5) {
        sVar5 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      local_70.indx = uVar9;
      memcpy(local_70.text,pcVar1,sVar5);
      local_70.text_len = (uint32_t)sVar5;
      this = (hashtest *)&local_98;
      phVar6 = LruHash<hashTestKey>::InsertOrAdd(&local_98,&local_70,true,&local_a9);
      if (uVar9 == 0x41) {
        bVar2 = LruCheck(this,&local_98);
      }
      if ((local_a9 & 1U) == 0) {
        bVar2 = false;
      }
      bVar3 = false;
      if (phVar6 != (hashTestKey *)0x0) {
        bVar3 = bVar2;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 < local_a8) && (bVar2 = bVar3, bVar3 != false));
    bVar2 = false;
    if ((ulong)local_98.binHash._0_8_ >> 0x20 == local_a8) {
      bVar2 = bVar3;
    }
    if (bVar3 == false) {
      bVar2 = bVar3;
    }
    if (bVar2 != false) goto LAB_0017d22e;
  }
  if ((local_a8 != 0) && (bVar2 != false)) {
    uVar9 = 0;
    do {
      pcVar1 = local_a0[uVar9];
      sVar5 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      if (0xf < sVar5) {
        sVar5 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      local_70.indx = uVar9;
      memcpy(local_70.text,pcVar1,sVar5);
      local_70.text_len = (uint32_t)sVar5;
      this = (hashtest *)&local_98;
      phVar6 = LruHash<hashTestKey>::InsertOrAdd
                         ((LruHash<hashTestKey> *)this,&local_70,true,&local_a9);
      if ((phVar6 == (hashTestKey *)0x0) || (local_a9 == true)) goto LAB_0017d5bc;
      if (phVar6->count != 2) {
        bVar2 = false;
      }
    } while ((bVar2 != false) && (uVar9 = uVar9 + 1, uVar9 < local_a8));
  }
  if (bVar2 != false) {
    bVar2 = LruCheck(this,&local_98);
  }
  if ((local_a8 != 0) && (bVar2 != false)) {
    uVar9 = 0;
    do {
      pcVar1 = local_a0[uVar9];
      sVar5 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      if (0xf < sVar5) {
        sVar5 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      local_70.indx = uVar9;
      memcpy(local_70.text,pcVar1,sVar5);
      local_70.text_len = (uint32_t)sVar5;
      phVar6 = LruHash<hashTestKey>::Retrieve(&local_98,&local_70);
      if ((phVar6 == (hashTestKey *)0x0) || (phVar6->text_len != local_70.text_len))
      goto LAB_0017d5bc;
      this = (hashtest *)phVar6->text;
      iVar4 = bcmp(this,local_70.text,(ulong)phVar6->text_len);
      if (iVar4 != 0) goto LAB_0017d5bc;
      if (phVar6->count != 2) {
        bVar2 = false;
      }
    } while ((bVar2 != false) && (uVar9 = uVar9 + 1, uVar9 < local_a8));
  }
  if (bVar2 != false) {
    bVar2 = LruCheck(this,&local_98);
  }
  if (bVar2 != false) {
    ppcVar10 = to_not_hash;
    uVar9 = 0;
    do {
      pcVar1 = *ppcVar10;
      sVar5 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      local_70.indx = 0xff;
      if (0xf < sVar5) {
        sVar5 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      memcpy(local_70.text,pcVar1,sVar5);
      local_70.text_len = (uint32_t)sVar5;
      this_00 = &local_98;
      phVar6 = LruHash<hashTestKey>::Retrieve(this_00,&local_70);
      if (phVar6 != (hashTestKey *)0x0) {
        bVar2 = false;
      }
      if (5 < uVar9) break;
      uVar9 = uVar9 + 1;
      ppcVar10 = ppcVar10 + 1;
    } while (bVar2 != false);
    if (bVar2 != false) {
      bVar2 = LruCheck((hashtest *)this_00,&local_98);
    }
  }
  if (bVar2 != false) {
    uVar9 = local_a8 >> 1;
    pcVar1 = local_a0[uVar9];
    sVar7 = strlen(pcVar1);
    sVar5 = 0x10;
    if (sVar7 < 0x10) {
      sVar5 = sVar7;
    }
    local_70.count = 1;
    local_70.hash = 0;
    local_70.HashNext = (hashTestKey *)0x0;
    local_70.LessRecentKey = (hashTestKey *)0x0;
    local_70.MoreRecentKey = (hashTestKey *)0x0;
    local_70.indx = uVar9;
    memcpy(local_70.text,pcVar1,sVar5);
    local_70.text_len = (uint32_t)sVar5;
    phVar6 = LruHash<hashTestKey>::Remove(&local_98,&local_70);
    if (phVar6 != (hashTestKey *)0x0) {
      operator_delete(phVar6);
      local_a8 = local_a8 - 1;
      if (local_a8 == (ulong)local_98.binHash._0_8_ >> 0x20) {
        bVar2 = LruCheck((hashtest *)phVar6,&local_98);
        goto LAB_0017d566;
      }
    }
    bVar2 = false;
  }
LAB_0017d566:
  if (bVar2 == false) {
LAB_0017d5bc:
    bVar2 = false;
  }
  else {
    uVar9 = (ulong)local_98.binHash._0_8_ >> 0x20;
    while ((bVar2 = (int)uVar9 == 0, !bVar2 &&
           (phVar6 = LruHash<hashTestKey>::Remove(&local_98,local_98.LeastRecentlyUsed),
           phVar6 != (hashTestKey *)0x0))) {
      uVar8 = local_a8 - 1;
      operator_delete(phVar6);
      uVar9 = (ulong)local_98.binHash._0_8_ >> 0x20;
      local_a8 = uVar8;
      if ((uVar8 != uVar9) || (bVar3 = LruCheck((hashtest *)phVar6,&local_98), !bVar3)) break;
    }
  }
  BinHash<hashTestKey>::Clear(&local_98.binHash);
  local_98.MostRecentlyUsed = (hashTestKey *)0x0;
  local_98.LeastRecentlyUsed = (hashTestKey *)0x0;
  BinHash<hashTestKey>::Clear(&local_98.binHash);
  return bVar2;
}

Assistant:

bool hashtest::DoLruHashTest(char const ** hash_input, size_t nb_input)
{
    LruHash<hashTestKey> hashTable;
    size_t target_size = nb_input;
    bool ret = true;

    /* Enter all the data in the input table */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (i == 0x41)
        {
            ret = LruCheck((void*)&hashTable);
        }

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!stored)
        {
            ret = false;
        }
    }

    if (ret && hashTable.GetCount() != target_size)
    {
        ret = false;
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be rewritten without creating new entries */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (stored)
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be retrieved */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!key.IsSameKey(retKey))
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the non-data cannot be retrieved */
    for (size_t i = 0; ret && i < size_to_not_hash; i++)
    {
        hashTestKey key((uint8_t const *)to_not_hash[i], strlen(to_not_hash[i]), 0xFF);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey != NULL)
        {
            ret = false;
        }
    }

    /* Check that the LRU Hash order is correct -- should be same as table order */

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Delete some random object, then check the table */
    if (ret)
    {
        size_t i = nb_input / 2;
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        hashTestKey * retKey = hashTable.Remove(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;
            target_size--;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }     
        }
    }

    /* Delete the LRU object, then check the table */
    while (ret && hashTable.GetCount() > 0)
    {
        hashTestKey * retKey = hashTable.RemoveLRU();
        target_size--;

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }
        }
    }
    return ret;
}